

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O2

QColor __thiscall QColormap::colorAt(QColormap *this,uint pixel)

{
  QColor QVar1;
  long in_FS_OFFSET;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d->mode == Direct) {
    if (this->d->depth == 0x10) {
      pixel = qt_conv16ToRgb((ushort)pixel);
    }
    QColor::QColor(&local_18,pixel >> 0x10 & 0xff,pixel >> 8 & 0xff,pixel & 0xff,0xff);
  }
  else {
    local_18.cspec = Invalid;
    local_18.ct.argb.alpha = 0xffff;
    local_18.ct.argb.red = 0;
    local_18.ct._4_6_ = 0;
  }
  QVar1.ct.argb.alpha = local_18.ct.argb.alpha;
  QVar1.cspec = local_18.cspec;
  QVar1.ct.argb.red = local_18.ct.argb.red;
  QVar1.ct._4_6_ = local_18.ct._4_6_;
  QVar1._14_2_ = local_18._14_2_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

const QColor QColormap::colorAt(uint pixel) const
{
    if (d->mode == Direct) {
        if (d->depth == 16) {
            pixel = qt_conv16ToRgb(pixel);
        }
        const int red_shift = 16;
        const int green_shift = 8;
        const int red_mask   = 0xff0000;
        const int green_mask = 0x00ff00;
        const int blue_mask  = 0x0000ff;
        return QColor((pixel & red_mask) >> red_shift,
                      (pixel & green_mask) >> green_shift,
                      (pixel & blue_mask));
    }
#if 0 // XXX
    Q_ASSERT_X(int(pixel) < qt_screen->numCols(), "QColormap::colorAt", "pixel out of bounds of palette");
    return QColor(qt_screen->clut()[pixel]);
#endif
    return QColor();
}